

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O0

void cmime_string_list_insert(CMimeStringList_T *sl,char *s)

{
  char **ppcVar1;
  char *pcVar2;
  char **tmp;
  char *s_local;
  CMimeStringList_T *sl_local;
  
  if (sl == (CMimeStringList_T *)0x0) {
    __assert_fail("sl",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x36,"void cmime_string_list_insert(CMimeStringList_T *, const char *)");
  }
  if (s != (char *)0x0) {
    ppcVar1 = (char **)realloc(sl->node,(sl->count + 1) * 8);
    pcVar2 = strdup(s);
    ppcVar1[sl->count] = pcVar2;
    sl->node = ppcVar1;
    sl->count = sl->count + 1;
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                ,0x37,"void cmime_string_list_insert(CMimeStringList_T *, const char *)");
}

Assistant:

void cmime_string_list_insert(CMimeStringList_T *sl, const char *s) {
    char **tmp = NULL;
    assert(sl);
    assert(s);

    tmp = realloc(sl->node, (sizeof( *tmp) * (sl->count+1)));
    tmp[sl->count] = strdup(s);
    sl->node = tmp;
    sl->count++;
}